

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnyDistributionEdgeCalculator.cpp
# Opt level: O0

void __thiscall
AnyDistributionEdgeCalculator::AnyDistributionEdgeCalculator
          (AnyDistributionEdgeCalculator *this,double significance_level,
          HistogramBasedDistribution *ild)

{
  int iVar1;
  pointer pvVar2;
  size_type sVar3;
  reference pvVar4;
  EdgeCalculator *in_RDI;
  _func_int **in_XMM0_Qa;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  vector<double,_std::allocator<double>_> *in_stack_00000008;
  AnyDistributionEdgeCalculator *in_stack_00000030;
  unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
  insert_size_sum_dist;
  size_t i_1;
  size_t i;
  double sum;
  HistogramBasedDistribution *in_stack_00000068;
  size_type in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffff80;
  ulong local_48;
  ulong local_40;
  double local_38;
  EdgeCalculator *pEVar5;
  
  pEVar5 = in_RDI;
  EdgeCalculator::EdgeCalculator(in_RDI);
  in_RDI->_vptr_EdgeCalculator = (_func_int **)&PTR__AnyDistributionEdgeCalculator_00353030;
  in_RDI[1]._vptr_EdgeCalculator = in_XMM0_Qa;
  HistogramBasedDistribution::toDistribution(in_stack_00000068,sum,(int *)i);
  pvVar2 = std::
           unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
           ::release((unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
                      *)0x27b6c9);
  in_RDI[3]._vptr_EdgeCalculator = (_func_int **)pvVar2;
  std::
  unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
  ::~unique_ptr(in_stack_ffffffffffffff80);
  local_38 = 0.0;
  local_40 = 0;
  while( true ) {
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)in_RDI[3]._vptr_EdgeCalculator);
    if (sVar3 <= local_40) break;
    pvVar4 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff68);
    local_38 = *pvVar4 + local_38;
    local_40 = local_40 + 1;
  }
  local_48 = 0;
  while( true ) {
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)in_RDI[3]._vptr_EdgeCalculator);
    if (sVar3 <= local_48) break;
    in_stack_ffffffffffffff80 =
         (unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
          *)std::vector<double,_std::allocator<double>_>::at
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       in_stack_ffffffffffffff68);
    (in_stack_ffffffffffffff80->_M_t).
    super___uniq_ptr_impl<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>_*,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
    .super__Head_base<0UL,_std::vector<double,_std::allocator<double>_>_*,_false>._M_head_impl =
         (vector<double,_std::allocator<double>_> *)
         ((double)(in_stack_ffffffffffffff80->_M_t).
                  super___uniq_ptr_impl<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>_*,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
                  .super__Head_base<0UL,_std::vector<double,_std::allocator<double>_>_*,_false>.
                  _M_head_impl / local_38);
    local_48 = local_48 + 1;
  }
  iVar1 = computeAllowableInsertSizeDiff(in_stack_00000030);
  *(int *)&in_RDI[2]._vptr_EdgeCalculator = iVar1;
  Distributions::convolve
            (in_stack_00000008,unaff_retaddr,(int)((ulong)pEVar5 >> 0x20),(int)pEVar5,
             (int *)in_XMM0_Qa);
  std::
  unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
  ::operator*((unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
               *)CONCAT44(iVar1,in_stack_ffffffffffffff70));
  Distributions::toCCDF(in_stack_00000008);
  pvVar2 = std::
           unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
           ::release((unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
                      *)0x27b848);
  in_RDI[5]._vptr_EdgeCalculator = (_func_int **)pvVar2;
  std::
  unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
  ::~unique_ptr(in_stack_ffffffffffffff80);
  std::
  unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
  ::~unique_ptr(in_stack_ffffffffffffff80);
  return;
}

Assistant:

AnyDistributionEdgeCalculator::AnyDistributionEdgeCalculator(double significance_level, const HistogramBasedDistribution& ild) : significance_level(significance_level) {
	this->insert_size_dist = ild.toDistribution(1e-4, &insert_size_dist_offset).release();
// 	cerr << "Using internal segment size distribution: " << endl;
// 	for (int i=0; i < (int)insert_size_dist->size(); ++i) {
// 		cerr << (i+insert_size_dist_offset) << " " << insert_size_dist->at(i) << endl;
// 	}
	// since we truncated the tails (a bit), we renormalize back to one
	double sum = 0.0;
	for (size_t i=0; i < insert_size_dist->size(); ++i) sum += insert_size_dist->at(i);
	for (size_t i=0; i < insert_size_dist->size(); ++i) insert_size_dist->at(i) /= sum;
	allowable_insert_size_diff = computeAllowableInsertSizeDiff();
	// cout << "allowable insert size difference: " << allowable_insert_size_diff << endl;
	unique_ptr<vector<double> > insert_size_sum_dist = Distributions::convolve(*insert_size_dist, *insert_size_dist, insert_size_dist_offset, insert_size_dist_offset, &insert_size_sum_ccdf_offset);
	this->insert_size_sum_ccdf = Distributions::toCCDF(*insert_size_sum_dist).release();
}